

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void __thiscall
pybind11::enum_<ki::protocol::net::ReceiveState>::enum_<>
          (enum_<ki::protocol::net::ReceiveState> *this,handle *scope,char *name)

{
  PyObject *pPVar1;
  cpp_function setstate;
  type local_41;
  handle local_40;
  is_method local_38;
  PyObject *local_30;
  char *local_28;
  object local_20;
  
  class_<ki::protocol::net::ReceiveState>::class_<>
            (&this->super_class_<ki::protocol::net::ReceiveState>,(handle)scope->m_ptr,name);
  pPVar1 = scope->m_ptr;
  (this->m_base).m_base.m_ptr =
       (this->super_class_<ki::protocol::net::ReceiveState>).super_generic_type.super_object.
       super_handle.m_ptr;
  (this->m_base).m_parent.m_ptr = pPVar1;
  detail::enum_base::init(&this->m_base,(EVP_PKEY_CTX *)0x0);
  class_<ki::protocol::net::ReceiveState>::
  def<pybind11::detail::initimpl::factory<pybind11::enum_<ki::protocol::net::ReceiveState>::enum_<>(pybind11::handle_const&,char_const*)::_lambda(int)_1_,pybind11::detail::void_type(*)(),ki::protocol::net::ReceiveState(int),pybind11::detail::void_type()>::execute<pybind11::class_<ki::protocol::net::ReceiveState>>(pybind11::class_<ki::protocol::net::ReceiveState>&)&&::_lambda(pybind11::detail::value_and_holder&,int)_1_,pybind11::detail::is_new_style_constructor>
            (&this->super_class_<ki::protocol::net::ReceiveState>,"__init__",(type *)&local_38,
             (is_new_style_constructor *)&local_40);
  class_<ki::protocol::net::ReceiveState>::
  def<pybind11::enum_<ki::protocol::net::ReceiveState>::enum_<>(pybind11::handle_const&,char_const*)::_lambda(ki::protocol::net::ReceiveState)_1_>
            (&this->super_class_<ki::protocol::net::ReceiveState>,"__int__",(type *)&local_38);
  local_38.class_.m_ptr =
       (handle)(this->super_class_<ki::protocol::net::ReceiveState>).super_generic_type.super_object
               .super_handle.m_ptr;
  cpp_function::
  cpp_function<pybind11::enum_<ki::protocol::net::ReceiveState>::enum_<>(pybind11::handle_const&,char_const*)::_lambda(ki::protocol::net::ReceiveState&,int)_1_,pybind11::is_method,void>
            ((cpp_function *)&local_40,&local_41,&local_38);
  local_30 = (this->super_class_<ki::protocol::net::ReceiveState>).super_generic_type.super_object.
             super_handle.m_ptr;
  local_28 = "__setstate__";
  local_20.super_handle.m_ptr = (handle)(PyObject *)0x0;
  detail::accessor_policies::str_attr::set((handle)local_30,"__setstate__",local_40);
  object::~object(&local_20);
  object::~object((object *)&local_40);
  return;
}

Assistant:

enum_(const handle &scope, const char *name, const Extra&... extra)
      : class_<Type>(scope, name, extra...), m_base(*this, scope) {
        constexpr bool is_arithmetic = detail::any_of<std::is_same<arithmetic, Extra>...>::value;
        constexpr bool is_convertible = std::is_convertible<Type, Scalar>::value;
        m_base.init(is_arithmetic, is_convertible);

        def(init([](Scalar i) { return static_cast<Type>(i); }));
        def("__int__", [](Type value) { return (Scalar) value; });
        #if PY_MAJOR_VERSION < 3
            def("__long__", [](Type value) { return (Scalar) value; });
        #endif
        cpp_function setstate(
            [](Type &value, Scalar arg) { value = static_cast<Type>(arg); },
            is_method(*this));
        attr("__setstate__") = setstate;
    }